

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCore.c
# Opt level: O2

void Dch_ComputeEquivalences(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Dch_Man_t *p;
  abctime aVar3;
  Dch_Cla_t *pDVar4;
  abctime aVar5;
  
  aVar2 = Abc_Clock();
  Aig_ManRandom(1);
  p = Dch_ManCreate(pAig,pPars);
  aVar3 = Abc_Clock();
  pDVar4 = Dch_CreateCandEquivClasses(pAig,pPars->nWords,pPars->fVerbose);
  p->ppClasses = pDVar4;
  aVar5 = Abc_Clock();
  p->timeSimInit = aVar5 - aVar3;
  iVar1 = Dch_ClassesLitNum(p->ppClasses);
  p->nLits = iVar1;
  Dch_ManSweep(p);
  aVar3 = Abc_Clock();
  p->timeTotal = aVar3 - aVar2;
  Dch_ManStop(p);
  return;
}

Assistant:

void Dch_ComputeEquivalences( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    Dch_Man_t * p;
    abctime clk, clkTotal = Abc_Clock();
    // reset random numbers
    Aig_ManRandom(1);
    // start the choicing manager
    p = Dch_ManCreate( pAig, pPars );
    // compute candidate equivalence classes
clk = Abc_Clock(); 
    p->ppClasses = Dch_CreateCandEquivClasses( pAig, pPars->nWords, pPars->fVerbose );
p->timeSimInit = Abc_Clock() - clk;
//    Dch_ClassesPrint( p->ppClasses, 0 );
    p->nLits = Dch_ClassesLitNum( p->ppClasses );
    // perform SAT sweeping
    Dch_ManSweep( p );
    // free memory ahead of time
p->timeTotal = Abc_Clock() - clkTotal;
    Dch_ManStop( p );
}